

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::JointAOHIndexToIndividualActionObservationVectors
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *indivO_vec,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *indivA_vec)

{
  _func_int *p_Var1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  code *pcVar3;
  undefined1 auVar4 [8];
  pointer puVar5;
  Index IVar6;
  int iVar7;
  undefined4 extraout_var;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  undefined4 extraout_var_00;
  Index *jaIs;
  ulong uVar9;
  Index *joIs;
  Index agentI;
  ulong __n;
  size_type sVar10;
  Index aIStack_b0 [2];
  Index *local_a8;
  Index *local_a0;
  undefined1 auStack_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivA_IndicesThisT;
  undefined1 auStack_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivO_IndicesThisT;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  ulong local_40;
  allocator_type local_32;
  allocator_type local_31;
  
  aIStack_b0[0] = 0x407b20;
  aIStack_b0[1] = 0;
  IVar6 = GetTimeStepForJAOHI(this,jaohI);
  __n = (ulong)IVar6;
  uVar9 = __n * 4 + 0xf & 0xfffffffffffffff0;
  joIs = (Index *)((long)&local_a8 - uVar9);
  jaIs = (Index *)((long)joIs - uVar9);
  local_a8 = joIs;
  local_a0 = jaIs;
  jaIs[-2] = 0x407b5c;
  jaIs[-1] = 0;
  GetJointActionObservationHistoryArrays(this,jaohI,IVar6,jaIs,joIs);
  p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
  jaIs[-2] = 0x407b65;
  jaIs[-1] = 0;
  iVar7 = (*p_Var1)(this);
  indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_40 = __n;
  jaIs[-2] = 0x407b86;
  jaIs[-1] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_58,__n,
             (value_type_conflict1 *)
             ((long)&indivO_IndicesThisT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),&local_32);
  jaIs[-2] = 0x407b9a;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)auStack_78,CONCAT44(extraout_var,iVar7),&local_58,&local_31);
  auStack_98 = (undefined1  [8])
               (indivO_vec->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(indivO_vec->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(indivO_vec->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (indivO_vec->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_78;
  (indivO_vec->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       (pointer)indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (indivO_vec->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  auStack_78 = (undefined1  [8])0x0;
  indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  jaIs[-2] = 0x407bf2;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)auStack_98);
  jaIs[-2] = 0x407bfa;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)auStack_78);
  puVar5 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    uVar9 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    jaIs[-2] = 0x407c0f;
    jaIs[-1] = 0;
    operator_delete(puVar5,uVar9);
  }
  uVar9 = local_40;
  indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  jaIs[-2] = 0x407c2a;
  jaIs[-1] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_58,uVar9,
             (value_type_conflict1 *)
             ((long)&indivO_IndicesThisT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),&local_32);
  jaIs[-2] = 0x407c3e;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)auStack_78,CONCAT44(extraout_var,iVar7),&local_58,&local_31);
  auStack_98 = (undefined1  [8])
               (indivA_vec->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(indivA_vec->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(indivA_vec->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (indivA_vec->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_78;
  (indivA_vec->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       (pointer)indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (indivA_vec->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  auStack_78 = (undefined1  [8])0x0;
  indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indivO_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  jaIs[-2] = 0x407c90;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)auStack_98);
  jaIs[-2] = 0x407c98;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)auStack_78);
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    jaIs[-2] = 0x407cad;
    jaIs[-1] = 0;
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40 != 0) {
    sVar10 = 0;
    do {
      IVar6 = local_a0[sVar10];
      pMVar2 = this->_m_madp;
      pcVar3 = *(code **)((long)*pMVar2 + 0x98);
      jaIs[-2] = 0x407cd3;
      jaIs[-1] = 0;
      pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*pcVar3)(pMVar2,IVar6);
      jaIs[-2] = 0x407ce2;
      jaIs[-1] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98,pvVar8);
      IVar6 = local_a8[sVar10];
      pMVar2 = this->_m_madp;
      pcVar3 = *(code **)((long)*pMVar2 + 0xe8);
      jaIs[-2] = 0x407cfa;
      jaIs[-1] = 0;
      pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*pcVar3)(pMVar2,IVar6);
      jaIs[-2] = 0x407d06;
      jaIs[-1] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,pvVar8);
      uVar9 = 0;
      while( true ) {
        p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
        jaIs[-2] = 0x407d12;
        jaIs[-1] = 0;
        iVar7 = (*p_Var1)(this);
        auVar4 = auStack_78;
        if (CONCAT44(extraout_var_00,iVar7) <= uVar9) break;
        *(undefined4 *)
         (*(long *)&(indivO_vec->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar9].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data + sVar10 * 4) =
             *(undefined4 *)
              ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78)->
                      _M_impl).super__Vector_impl_data._M_start + uVar9 * 4);
        *(undefined4 *)
         (*(long *)&(indivA_vec->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar9].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data + sVar10 * 4) =
             *(undefined4 *)
              ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98)->
                      _M_impl).super__Vector_impl_data._M_start + uVar9 * 4);
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      if (auStack_78 != (undefined1  [8])0x0) {
        uVar9 = (long)indivO_IndicesThisT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)auStack_78;
        jaIs[-2] = 0x407d64;
        jaIs[-1] = 0;
        operator_delete((void *)auVar4,uVar9);
      }
      auVar4 = auStack_98;
      if (auStack_98 != (undefined1  [8])0x0) {
        uVar9 = (long)indivA_IndicesThisT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)auStack_98;
        jaIs[-2] = 0x407d7c;
        jaIs[-1] = 0;
        operator_delete((void *)auVar4,uVar9);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != local_40);
  }
  return;
}

Assistant:

void
PlanningUnitMADPDiscrete::JointAOHIndexToIndividualActionObservationVectors(
        LIndex jaohI,
        vector< vector<Index> >& indivO_vec,
        vector< vector<Index> >& indivA_vec
        ) const
{
    Index t = GetTimeStepForJAOHI(jaohI);
    Index jo_array[t];
    Index ja_array[t];

    GetJointActionObservationHistoryArrays(jaohI, t, ja_array, jo_array);      

    size_t nrAgents = GetNrAgents();
    //convert joint observations -> indiv. observations
    //indivO_vec[agentI][t] = oI
    indivO_vec = vector< vector<Index> >(nrAgents, vector<Index>(t, 0));
    indivA_vec = vector< vector<Index> >(nrAgents, vector<Index>(t, 0));
    for (Index ts=0; ts<t; ts++)
    {
        vector<Index> indivA_IndicesThisT = 
            JointToIndividualActionIndices(ja_array[ts]);
        vector<Index> indivO_IndicesThisT = 
            JointToIndividualObservationIndices(jo_array[ts]);
        for (Index agentI=0; agentI<GetNrAgents(); agentI++)
        {
            indivO_vec[agentI][ts] = indivO_IndicesThisT[agentI];
            indivA_vec[agentI][ts] = indivA_IndicesThisT[agentI];
        }
    }
}